

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fix_storage_class.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::FixStorageClass::PropagateType
          (FixStorageClass *this,Instruction *inst,uint32_t type_id,uint32_t op_idx,
          set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *seen)

{
  Op OVar1;
  pointer ppVar2;
  bool bVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  int iVar6;
  DefUseManager *pDVar7;
  Instruction *pIVar8;
  Instruction *ptrInst;
  TypeManager *pTVar9;
  Type *pTVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  pair<spvtools::opt::Instruction_*,_unsigned_int> *use;
  pointer ppVar11;
  pair<std::_Rb_tree_iterator<unsigned_int>,_bool> pVar12;
  initializer_list<unsigned_int> init_list;
  vector<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>
  uses;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  
  if (type_id == 0) {
    __assert_fail("type_id != 0 && \"Not given a valid type in PropagateType\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/fix_storage_class.cpp"
                  ,0xb7,
                  "bool spvtools::opt::FixStorageClass::PropagateType(Instruction *, uint32_t, uint32_t, std::set<uint32_t> *)"
                 );
  }
  OVar1 = inst->opcode_;
  switch(OVar1) {
  case OpLoad:
    pDVar7 = Pass::get_def_use_mgr(&this->super_Pass);
    pIVar8 = analysis::DefUseManager::GetDef(pDVar7,type_id);
    type_id = Instruction::GetSingleWordInOperand(pIVar8,1);
    break;
  case OpStore:
    uVar4 = Instruction::GetSingleWordInOperand(inst,1);
    pDVar7 = Pass::get_def_use_mgr(&this->super_Pass);
    pIVar8 = analysis::DefUseManager::GetDef(pDVar7,uVar4);
    uVar4 = Instruction::type_id(pIVar8);
    uVar5 = Instruction::GetSingleWordInOperand(inst,0);
    pDVar7 = Pass::get_def_use_mgr(&this->super_Pass);
    ptrInst = analysis::DefUseManager::GetDef(pDVar7,uVar5);
    uVar5 = Pass::GetPointeeTypeId(&this->super_Pass,ptrInst);
    if (uVar4 == uVar5) {
      return false;
    }
    pTVar9 = IRContext::get_type_mgr((this->super_Pass).context_);
    pTVar10 = analysis::TypeManager::GetType(pTVar9,uVar4);
    iVar6 = (*pTVar10->_vptr_Type[0x11])(pTVar10);
    if (CONCAT44(extraout_var,iVar6) != 0) {
      pTVar9 = IRContext::get_type_mgr((this->super_Pass).context_);
      pTVar10 = analysis::TypeManager::GetType(pTVar9,uVar5);
      iVar6 = (*pTVar10->_vptr_Type[0x11])(pTVar10);
      if (CONCAT44(extraout_var_00,iVar6) != 0) {
        return false;
      }
    }
    uVar4 = Pass::GenerateCopy(&this->super_Pass,pIVar8,uVar5,inst);
    if (uVar4 == 0) {
      return false;
    }
    uses.
    super__Vector_base<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(uses.
                           super__Vector_base<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,uVar4);
    init_list._M_len = 1;
    init_list._M_array = (iterator)&uses;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector
              ((SmallVector<unsigned_int,_2UL> *)&local_58,init_list);
    Instruction::SetInOperand(inst,1,(OperandData *)&local_58);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector((SmallVector<unsigned_int,_2UL> *)&local_58)
    ;
    IRContext::UpdateDefUse((this->super_Pass).context_,inst);
    return false;
  case OpCopyMemory:
  case OpCopyMemorySized:
  case OpArrayLength:
  case OpGenericPtrMemSemantics:
    goto switchD_004e7adb_caseD_3f;
  case OpAccessChain:
  case OpInBoundsAccessChain:
  case OpPtrAccessChain:
  case OpInBoundsPtrAccessChain:
    if (op_idx != 2) {
      return false;
    }
    type_id = WalkAccessChainType(this,inst,type_id);
    break;
  default:
    if (OVar1 != OpCopyObject) {
      if (OVar1 == OpSelect) {
        if (op_idx < 3) {
          return false;
        }
      }
      else {
        if (OVar1 != OpPhi) {
          return false;
        }
        uVar4 = Instruction::result_id(inst);
        local_58._0_4_ = uVar4;
        pVar12 = std::
                 _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                 ::_M_insert_unique<unsigned_int>(&seen->_M_t,(uint *)local_58._M_pod_data);
        if (((undefined1  [16])pVar12 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          return false;
        }
      }
    }
    goto LAB_004e7b5b;
  }
  if (type_id != 0) {
LAB_004e7b5b:
    bVar3 = ChangeResultType(this,inst,type_id);
    uses.
    super__Vector_base<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    uses.
    super__Vector_base<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    uses.
    super__Vector_base<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pDVar7 = Pass::get_def_use_mgr(&this->super_Pass);
    local_58._8_8_ = 0;
    local_40 = std::
               _Function_handler<void_(spvtools::opt::Instruction_*,_unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/fix_storage_class.cpp:283:35)>
               ::_M_invoke;
    local_48 = std::
               _Function_handler<void_(spvtools::opt::Instruction_*,_unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/fix_storage_class.cpp:283:35)>
               ::_M_manager;
    local_58._M_unused._M_object = &uses;
    analysis::DefUseManager::ForEachUse
              (pDVar7,inst,(function<void_(spvtools::opt::Instruction_*,_unsigned_int)> *)&local_58)
    ;
    ppVar11 = uses.
              super__Vector_base<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppVar2 = uses.
             super__Vector_base<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (local_48 != (code *)0x0) {
      (*local_48)(&local_58,&local_58,3);
      ppVar11 = uses.
                super__Vector_base<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppVar2 = uses.
               super__Vector_base<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
    for (; ppVar11 != ppVar2; ppVar11 = ppVar11 + 1) {
      PropagateType(this,ppVar11->first,type_id,ppVar11->second,seen);
    }
    if (inst->opcode_ == OpPhi) {
      uVar4 = Instruction::result_id(inst);
      local_58._0_4_ = uVar4;
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::erase(&seen->_M_t,(key_type *)local_58._M_pod_data);
    }
    std::
    _Vector_base<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>
    ::~_Vector_base(&uses.
                     super__Vector_base<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>
                   );
    return bVar3;
  }
switchD_004e7adb_caseD_3f:
  return false;
}

Assistant:

bool FixStorageClass::PropagateType(Instruction* inst, uint32_t type_id,
                                    uint32_t op_idx, std::set<uint32_t>* seen) {
  assert(type_id != 0 && "Not given a valid type in PropagateType");
  bool modified = false;

  // If the type of operand |op_idx| forces the result type of |inst| to a
  // particular type, then we want find that type.
  uint32_t new_type_id = 0;
  switch (inst->opcode()) {
    case spv::Op::OpAccessChain:
    case spv::Op::OpPtrAccessChain:
    case spv::Op::OpInBoundsAccessChain:
    case spv::Op::OpInBoundsPtrAccessChain:
      if (op_idx == 2) {
        new_type_id = WalkAccessChainType(inst, type_id);
      }
      break;
    case spv::Op::OpCopyObject:
      new_type_id = type_id;
      break;
    case spv::Op::OpPhi:
      if (seen->insert(inst->result_id()).second) {
        new_type_id = type_id;
      }
      break;
    case spv::Op::OpSelect:
      if (op_idx > 2) {
        new_type_id = type_id;
      }
      break;
    case spv::Op::OpFunctionCall:
      // We cannot be sure of the actual connection between the type
      // of the parameter and the type of the result, so we should not
      // do anything.  If the result type needs to be fixed, the function call
      // should be inlined.
      return false;
    case spv::Op::OpLoad: {
      Instruction* type_inst = get_def_use_mgr()->GetDef(type_id);
      new_type_id = type_inst->GetSingleWordInOperand(1);
      break;
    }
    case spv::Op::OpStore: {
      uint32_t obj_id = inst->GetSingleWordInOperand(1);
      Instruction* obj_inst = get_def_use_mgr()->GetDef(obj_id);
      uint32_t obj_type_id = obj_inst->type_id();

      uint32_t ptr_id = inst->GetSingleWordInOperand(0);
      Instruction* ptr_inst = get_def_use_mgr()->GetDef(ptr_id);
      uint32_t pointee_type_id = GetPointeeTypeId(ptr_inst);

      if (obj_type_id != pointee_type_id) {
        if (context()->get_type_mgr()->GetType(obj_type_id)->AsImage() &&
            context()->get_type_mgr()->GetType(pointee_type_id)->AsImage()) {
          // When storing an image, allow the type mismatch
          // and let the later legalization passes eliminate the OpStore.
          // This is to support assigning an image to a variable,
          // where the assigned image does not have a pre-defined
          // image format.
          return false;
        }

        uint32_t copy_id = GenerateCopy(obj_inst, pointee_type_id, inst);
        if (copy_id == 0) {
          return false;
        }
        inst->SetInOperand(1, {copy_id});
        context()->UpdateDefUse(inst);
      }
    } break;
    case spv::Op::OpCopyMemory:
    case spv::Op::OpCopyMemorySized:
      // TODO: May need to expand the copy as we do with the stores.
      break;
    case spv::Op::OpCompositeConstruct:
    case spv::Op::OpCompositeExtract:
    case spv::Op::OpCompositeInsert:
      // TODO: DXC does not seem to generate code that will require changes to
      // these opcode.  The can be implemented when they come up.
      break;
    case spv::Op::OpImageTexelPointer:
    case spv::Op::OpBitcast:
      // Nothing to change for these opcode.  The result type is the same
      // regardless of the type of the operand.
      return false;
    default:
      // I expect the remaining instructions to act on types that are guaranteed
      // to be unique, so no change will be necessary.
      break;
  }

  // If the operand forces the result type, then make sure the result type
  // matches, and update the uses of |inst|.  We do not have to check the uses
  // of |inst| in the result type is not forced because we are only looking for
  // issue that come from mismatches between function formal and actual
  // parameters after the function has been inlined.  These parameters are
  // pointers. Once the type no longer depends on the type of the parameter,
  // then the types should have be correct.
  if (new_type_id != 0) {
    modified = ChangeResultType(inst, new_type_id);

    std::vector<std::pair<Instruction*, uint32_t>> uses;
    get_def_use_mgr()->ForEachUse(inst,
                                  [&uses](Instruction* use, uint32_t idx) {
                                    uses.push_back({use, idx});
                                  });

    for (auto& use : uses) {
      PropagateType(use.first, new_type_id, use.second, seen);
    }

    if (inst->opcode() == spv::Op::OpPhi) {
      seen->erase(inst->result_id());
    }
  }
  return modified;
}